

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txb_rdopt_utils.h
# Opt level: O2

int get_br_cost_with_diff(tran_low_t level,int *coeff_lps,int *diff)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  
  iVar2 = 0xf;
  if (level < 0xf) {
    iVar2 = level;
  }
  if (level < 0x10) {
    iVar3 = *diff + coeff_lps[(long)iVar2 + 10];
    *diff = iVar3;
    uVar1 = 0;
    if (level != 0xf) goto LAB_00970920;
    uVar5 = 1;
LAB_009708dd:
    uVar1 = golomb_bits_cost[uVar5];
    iVar3 = iVar3 + golomb_cost_diff[uVar5];
  }
  else {
    uVar4 = level - 0xe;
    uVar5 = (ulong)uVar4;
    iVar3 = *diff;
    if ((uint)level < 0x2e) goto LAB_009708dd;
    uVar1 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
      }
    }
    uVar1 = (uVar1 ^ 0x1f) << 10 ^ 0x7e00;
    iVar3 = iVar3 + (uint)((uVar4 & level - 0xfU) == 0) * 0x400;
  }
  *diff = iVar3;
LAB_00970920:
  return uVar1 + coeff_lps[(long)iVar2 + -3];
}

Assistant:

static inline int get_br_cost_with_diff(tran_low_t level, const int *coeff_lps,
                                        int *diff) {
  const int base_range = AOMMIN(level - 1 - NUM_BASE_LEVELS, COEFF_BASE_RANGE);
  int golomb_bits = 0;
  if (level <= COEFF_BASE_RANGE + 1 + NUM_BASE_LEVELS)
    *diff += coeff_lps[base_range + COEFF_BASE_RANGE + 1];

  if (level >= COEFF_BASE_RANGE + 1 + NUM_BASE_LEVELS) {
    int r = level - COEFF_BASE_RANGE - NUM_BASE_LEVELS;
    if (r < 32) {
      golomb_bits = golomb_bits_cost[r];
      *diff += golomb_cost_diff[r];
    } else {
      golomb_bits = get_golomb_cost(level);
      *diff += (r & (r - 1)) == 0 ? 1024 : 0;
    }
  }

  return coeff_lps[base_range] + golomb_bits;
}